

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_7a7af::IntrusiveListTest::TearDown(IntrusiveListTest *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_30.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"0","TestObject::creation_count",(int *)&local_30,
             &(anonymous_namespace)::TestObject::creation_count);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
               ,0x4c,message);
    testing::internal::AssertHelper::operator=(&local_18,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

virtual void TearDown() { ASSERT_EQ(0, TestObject::creation_count); }